

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  CClient *this;
  IKernel *pIVar5;
  IEngine *pIVar6;
  IConsole *pIVar7;
  IStorage *pIVar8;
  IConfigManager *pIVar9;
  IEngineSound *pIVar10;
  IEngineInput *pIVar11;
  IEngineTextRender *pIVar12;
  IEngineMap *pIVar13;
  CClient *this_00;
  IEngineMasterServer *pIVar14;
  IGameClient *pIVar15;
  IEngine *pIVar16;
  char **in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  char *pAddress;
  bool RegisterFail;
  IEngineMasterServer *pEngineMasterServer;
  IMapChecker *pMapChecker;
  IEngineMap *pEngineMap;
  IEngineTextRender *pEngineTextRender;
  IEngineInput *pEngineInput;
  IEngineSound *pEngineSound;
  IConfigManager *pConfigManager;
  IStorage *pStorage;
  IConsole *pConsole;
  IEngine *pEngine;
  int FlagMask;
  IKernel *pKernel;
  CClient *pClient;
  bool RandInitFailed;
  int i;
  bool UseDefaultConfig;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  CClient *in_stack_fffffffffffffef0;
  byte local_c9;
  byte local_b9;
  byte local_af;
  byte local_ae;
  byte local_ad;
  byte local_ac;
  byte local_ab;
  byte local_aa;
  byte local_a9;
  byte local_a8;
  byte local_a7;
  byte local_a6;
  byte local_a5;
  byte local_a4;
  byte local_a3;
  byte local_a2;
  char *local_a0;
  int local_24;
  int local_1c;
  char **local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_RSI;
  local_c = in_EDI;
  cmdline_fix(&local_c,&local_18);
  bVar1 = false;
  local_24 = 1;
  do {
    if (local_c <= local_24) {
LAB_001280f7:
      iVar3 = secure_random_init();
      this = CreateClient();
      pIVar5 = IKernel::Create();
      IKernel::RegisterInterface<CClient>
                ((IKernel *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (CClient *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      CClient::RegisterInterfaces
                ((CClient *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      pIVar6 = CreateEngine(in_stack_fffffffffffffee0);
      pIVar7 = CreateConsole((int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      pIVar8 = CreateStorage((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,(char **)0x12819a);
      pIVar9 = CreateConfigManager();
      pIVar10 = CreateEngineSound();
      pIVar11 = CreateEngineInput();
      pIVar12 = CreateEngineTextRender();
      pIVar13 = CreateEngineMap();
      this_00 = (CClient *)CreateMapChecker();
      pIVar14 = CreateEngineMasterServer();
      if (iVar3 == 0) {
        bVar2 = IKernel::RegisterInterface<IEngine>
                          ((IKernel *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           (IEngine *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
        ;
        local_a2 = 1;
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          bVar2 = IKernel::RegisterInterface<IConsole>
                            ((IKernel *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (IConsole *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_a2 = bVar2 ^ 0xff;
        }
        local_a3 = 1;
        if ((local_a2 & 1) == 0) {
          bVar2 = IKernel::RegisterInterface<IConfigManager>
                            ((IKernel *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (IConfigManager *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_a3 = bVar2 ^ 0xff;
        }
        local_a4 = 1;
        if ((local_a3 & 1) == 0) {
          bVar2 = IKernel::RegisterInterface<IEngineSound>
                            ((IKernel *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (IEngineSound *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_a4 = bVar2 ^ 0xff;
        }
        local_a5 = 1;
        if ((local_a4 & 1) == 0) {
          bVar2 = IKernel::RegisterInterface<ISound>
                            ((IKernel *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (ISound *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                            );
          local_a5 = bVar2 ^ 0xff;
        }
        local_a6 = 1;
        if ((local_a5 & 1) == 0) {
          bVar2 = IKernel::RegisterInterface<IEngineInput>
                            ((IKernel *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (IEngineInput *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_a6 = bVar2 ^ 0xff;
        }
        local_a7 = 1;
        if ((local_a6 & 1) == 0) {
          bVar2 = IKernel::RegisterInterface<IInput>
                            ((IKernel *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (IInput *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                            );
          local_a7 = bVar2 ^ 0xff;
        }
        local_a8 = 1;
        if ((local_a7 & 1) == 0) {
          bVar2 = IKernel::RegisterInterface<IEngineTextRender>
                            ((IKernel *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (IEngineTextRender *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_a8 = bVar2 ^ 0xff;
        }
        local_a9 = 1;
        if ((local_a8 & 1) == 0) {
          bVar2 = IKernel::RegisterInterface<ITextRender>
                            ((IKernel *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (ITextRender *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_a9 = bVar2 ^ 0xff;
        }
        local_aa = 1;
        if ((local_a9 & 1) == 0) {
          bVar2 = IKernel::RegisterInterface<IEngineMap>
                            ((IKernel *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (IEngineMap *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_aa = bVar2 ^ 0xff;
        }
        local_ab = 1;
        if ((local_aa & 1) == 0) {
          bVar2 = IKernel::RegisterInterface<IMap>
                            ((IKernel *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (IMap *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_ab = bVar2 ^ 0xff;
        }
        local_ac = 1;
        if ((local_ab & 1) == 0) {
          bVar2 = IKernel::RegisterInterface<IMapChecker>
                            ((IKernel *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (IMapChecker *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_ac = bVar2 ^ 0xff;
        }
        local_ad = 1;
        if ((local_ac & 1) == 0) {
          bVar2 = IKernel::RegisterInterface<IEngineMasterServer>
                            ((IKernel *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (IEngineMasterServer *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_ad = bVar2 ^ 0xff;
        }
        local_ae = 1;
        if ((local_ad & 1) == 0) {
          bVar2 = IKernel::RegisterInterface<IMasterServer>
                            ((IKernel *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (IMasterServer *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_ae = bVar2 ^ 0xff;
        }
        local_af = 1;
        if ((local_ae & 1) == 0) {
          CreateEditor();
          bVar2 = IKernel::RegisterInterface<IEditor>
                            ((IKernel *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (IEditor *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_af = bVar2 ^ 0xff;
        }
        local_b9 = 1;
        if ((local_af & 1) == 0) {
          CreateGameClient();
          bVar2 = IKernel::RegisterInterface<IGameClient>
                            ((IKernel *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (IGameClient *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_b9 = bVar2 ^ 0xff;
        }
        local_c9 = 1;
        if ((local_b9 & 1) == 0) {
          bVar2 = IKernel::RegisterInterface<IStorage>
                            ((IKernel *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (IStorage *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          local_c9 = bVar2 ^ 0xff;
        }
        if ((local_c9 & 1) == 0) {
          (*(pIVar6->super_IInterface)._vptr_IInterface[2])();
          (*(pIVar9->super_IInterface)._vptr_IInterface[2])(pIVar9,2);
          (*(pIVar7->super_IInterface)._vptr_IInterface[2])();
          (*(pIVar14->super_IMasterServer).super_IInterface._vptr_IInterface[2])();
          (*(pIVar14->super_IMasterServer).super_IInterface._vptr_IInterface[4])();
          CClient::RegisterCommands
                    ((CClient *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
          CClient::InitInterfaces(in_stack_fffffffffffffef0);
          pIVar15 = IKernel::RequestInterface<IGameClient>
                              ((IKernel *)
                               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
          (*(pIVar15->super_IInterface)._vptr_IInterface[2])();
          if (!bVar1) {
            uVar4 = (*(pIVar7->super_IInterface)._vptr_IInterface[0x16])(pIVar7,"settings07.cfg");
            if ((uVar4 & 1) == 0) {
              (*(pIVar7->super_IInterface)._vptr_IInterface[0x16])(pIVar7,"settings.cfg");
            }
            (*(pIVar7->super_IInterface)._vptr_IInterface[0x16])(pIVar7,"autoexec.cfg");
            if (1 < local_c) {
              local_a0 = (char *)0x0;
              if (local_c == 2) {
                local_a0 = str_startswith(in_stack_fffffffffffffed8,
                                          (char *)CONCAT44(in_stack_fffffffffffffed4,
                                                           in_stack_fffffffffffffed0));
              }
              if (local_a0 == (char *)0x0) {
                (*(pIVar7->super_IInterface)._vptr_IInterface[7])
                          (pIVar7,(ulong)(local_c - 1),local_18 + 1);
              }
              else {
                CClient::ConnectOnStart
                          ((CClient *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
              }
            }
          }
          CClient::DoVersionSpecificActions((CClient *)0x128815);
          (*(pIVar9->super_IInterface)._vptr_IInterface[4])();
          pIVar16 = CClient::Engine(this);
          (*(pIVar16->super_IInterface)._vptr_IInterface[4])();
          dbg_msg("client","starting...");
          CClient::Run(this_00);
          (*(pIVar6->super_IInterface)._vptr_IInterface[3])();
          (*(pIVar9->super_IInterface)._vptr_IInterface[5])(pIVar9,0);
          (**(this->super_IClient).super_IInterface._vptr_IInterface)();
          mem_free((void *)0x128895);
          if (pIVar5 != (IKernel *)0x0) {
            (*pIVar5->_vptr_IKernel[4])();
          }
          if (pIVar6 != (IEngine *)0x0) {
            (*(pIVar6->super_IInterface)._vptr_IInterface[1])();
          }
          if (pIVar7 != (IConsole *)0x0) {
            (*(pIVar7->super_IInterface)._vptr_IInterface[1])();
          }
          if (pIVar8 != (IStorage *)0x0) {
            (*(pIVar8->super_IInterface)._vptr_IInterface[1])();
          }
          if (pIVar9 != (IConfigManager *)0x0) {
            (*(pIVar9->super_IInterface)._vptr_IInterface[1])();
          }
          if (pIVar10 != (IEngineSound *)0x0) {
            (*(pIVar10->super_ISound).super_IInterface._vptr_IInterface[1])();
          }
          if (pIVar11 != (IEngineInput *)0x0) {
            (*(pIVar11->super_IInput).super_IInterface._vptr_IInterface[1])();
          }
          if (pIVar12 != (IEngineTextRender *)0x0) {
            (*(pIVar12->super_ITextRender).super_IInterface._vptr_IInterface[1])();
          }
          if (pIVar13 != (IEngineMap *)0x0) {
            (*(pIVar13->super_IMap).super_IInterface._vptr_IInterface[1])();
          }
          if (this_00 != (CClient *)0x0) {
            (*(this_00->super_IClient).super_IInterface._vptr_IInterface[1])();
          }
          if (pIVar14 != (IEngineMasterServer *)0x0) {
            (*(pIVar14->super_IMasterServer).super_IInterface._vptr_IInterface[1])();
          }
          cmdline_free(local_c,local_18);
          local_1c = 0;
        }
        else {
          local_1c = -1;
        }
      }
      else {
        dbg_msg("secure","could not initialize secure RNG");
        local_1c = -1;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_1c;
      }
      __stack_chk_fail();
    }
    iVar3 = str_comp((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    if ((iVar3 == 0) ||
       (iVar3 = str_comp((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)),
       iVar3 == 0)) {
      bVar1 = true;
      goto LAB_001280f7;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int main(int argc, const char **argv) // ignore_convention
#endif
{
	cmdline_fix(&argc, &argv);
#if defined(CONF_FAMILY_WINDOWS)
	bool QuickEditMode = false;
	for(int i = 1; i < argc; i++) // ignore_convention
	{
		if(str_comp("--quickeditmode", argv[i]) == 0) // ignore_convention
		{
			QuickEditMode = true;
		}
	}
#endif

	bool UseDefaultConfig = false;
	for(int i = 1; i < argc; i++) // ignore_convention
	{
		if(str_comp("-d", argv[i]) == 0 || str_comp("--default", argv[i]) == 0) // ignore_convention
		{
			UseDefaultConfig = true;
			break;
		}
	}

	bool RandInitFailed = secure_random_init() != 0;

	CClient *pClient = CreateClient();
	IKernel *pKernel = IKernel::Create();
	pKernel->RegisterInterface(pClient);
	pClient->RegisterInterfaces();

	// create the components
	int FlagMask = CFGFLAG_CLIENT;
	IEngine *pEngine = CreateEngine("Teeworlds");
	IConsole *pConsole = CreateConsole(FlagMask);
	IStorage *pStorage = CreateStorage("Teeworlds", IStorage::STORAGETYPE_CLIENT, argc, argv); // ignore_convention
	IConfigManager *pConfigManager = CreateConfigManager();
	IEngineSound *pEngineSound = CreateEngineSound();
	IEngineInput *pEngineInput = CreateEngineInput();
	IEngineTextRender *pEngineTextRender = CreateEngineTextRender();
	IEngineMap *pEngineMap = CreateEngineMap();
	IMapChecker *pMapChecker = CreateMapChecker();
	IEngineMasterServer *pEngineMasterServer = CreateEngineMasterServer();

	if(RandInitFailed)
	{
		dbg_msg("secure", "could not initialize secure RNG");
		return -1;
	}

	{
		bool RegisterFail = false;

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(pEngine);
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(pConsole);
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(pConfigManager);

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IEngineSound*>(pEngineSound)); // register as both
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<ISound*>(pEngineSound));

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IEngineInput*>(pEngineInput)); // register as both
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IInput*>(pEngineInput));

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IEngineTextRender*>(pEngineTextRender)); // register as both
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<ITextRender*>(pEngineTextRender));

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IEngineMap*>(pEngineMap)); // register as both
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IMap*>(pEngineMap));

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(pMapChecker);

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IEngineMasterServer*>(pEngineMasterServer)); // register as both
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IMasterServer*>(pEngineMasterServer));

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(CreateEditor());
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(CreateGameClient());
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(pStorage);

		if(RegisterFail)
			return -1;
	}

	pEngine->Init();
	pConfigManager->Init(FlagMask);
	pConsole->Init();
	pEngineMasterServer->Init();
	pEngineMasterServer->Load();

	// register all console commands
	pClient->RegisterCommands();

	// init client's interfaces
	pClient->InitInterfaces();

	pKernel->RequestInterface<IGameClient>()->OnConsoleInit();

	if(!UseDefaultConfig)
	{
		// execute config file
		if(!pConsole->ExecuteFile(SETTINGS_FILENAME ".cfg"))
			pConsole->ExecuteFile("settings.cfg"); // fallback to legacy naming scheme

		// execute autoexec file
		pConsole->ExecuteFile("autoexec.cfg");

		// parse the command line arguments
		if(argc > 1) // ignore_convention
		{
			const char *pAddress = 0;
			if(argc == 2)
			{
				pAddress = str_startswith(argv[1], "teeworlds:");
			}
			if(pAddress)
			{
				pClient->ConnectOnStart(pAddress);
			}
			else
			{
				pConsole->ParseArguments(argc - 1, &argv[1]);
			}
		}
	}
#if defined(CONF_FAMILY_WINDOWS)
	CConfig *pConfig = pConfigManager->Values();
	bool HideConsole = false;
	#ifdef CONF_RELEASE
	if(!(pConfig->m_ShowConsoleWindow&2))
	#else
	if(!(pConfig->m_ShowConsoleWindow&1))
	#endif
	{
		HideConsole = true;
		FreeConsole();
	}
	else if(!QuickEditMode)
		dbg_console_init();
#endif

	pClient->DoVersionSpecificActions();

	// restore empty config strings to their defaults
	pConfigManager->RestoreStrings();

	pClient->Engine()->InitLogfile();

	// run the client
	dbg_msg("client", "starting...");
	pClient->Run();

	// wait for background jobs to finish
	pEngine->ShutdownJobs();

	// write down the config and quit
	pConfigManager->Save();

#if defined(CONF_FAMILY_WINDOWS)
	if(!HideConsole && !QuickEditMode)
		dbg_console_cleanup();
#endif
	// free components
	pClient->~CClient();
	mem_free(pClient);
	delete pKernel;
	delete pEngine;
	delete pConsole;
	delete pStorage;
	delete pConfigManager;
	delete pEngineSound;
	delete pEngineInput;
	delete pEngineTextRender;
	delete pEngineMap;
	delete pMapChecker;
	delete pEngineMasterServer;

	cmdline_free(argc, argv);
	return 0;
}